

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkconnectionchannel.cpp
# Opt level: O3

void __thiscall
QHttpNetworkConnectionChannel::checkAndResumeCommunication(QHttpNetworkConnectionChannel *this)

{
  if ((*(long *)(this + 0x38) == 0) &&
     ((*(long *)(this + 0x80) == 0 || (*(long *)(*(long *)(this + 0x80) + 0x30) == 0)))) {
    abort(this);
  }
  this[0x1a] = (QHttpNetworkConnectionChannel)0x0;
  if (this[0x1c] == (QHttpNetworkConnectionChannel)0x1) {
    (**(code **)(**(long **)(this + 0x78) + 0x18))();
  }
  if (this[0x1b] == (QHttpNetworkConnectionChannel)0x1) {
    if (this[0x1a] == (QHttpNetworkConnectionChannel)0x1) {
      this[0x1b] = (QHttpNetworkConnectionChannel)0x1;
    }
    else {
      (**(code **)(**(long **)(this + 0x78) + 0x10))();
    }
  }
  if (this[0x1d] == (QHttpNetworkConnectionChannel)0x1) {
    if (this[0x1a] != (QHttpNetworkConnectionChannel)0x1) {
      (**(code **)(**(long **)(this + 0x78) + 0x20))();
      return;
    }
    this[0x1d] = (QHttpNetworkConnectionChannel)0x1;
  }
  return;
}

Assistant:

void QHttpNetworkConnectionChannel::checkAndResumeCommunication()
{
    Q_ASSERT(connection->connectionType() == QHttpNetworkConnection::ConnectionTypeHTTP2
             || connection->connectionType() == QHttpNetworkConnection::ConnectionTypeHTTP2Direct);

    // Because HTTP/2 requires that we send a SETTINGS frame as the first thing we do, and respond
    // to a SETTINGS frame with an ACK, we need to delay any handling until we can ensure that any
    // effects from emitting encrypted() have been processed.
    // This function is called after encrypted() was emitted, so check for changes.

    if (!reply && h2RequestsToSend.isEmpty())
        abort();
    waitingForPotentialAbort = false;
    if (needInvokeReadyRead)
        _q_readyRead();
    if (needInvokeReceiveReply)
        _q_receiveReply();
    if (needInvokeSendRequest)
        sendRequest();
}